

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuImage.cpp
# Opt level: O1

int createBoxConstraints
              (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *coverMatrix,int header)

{
  ulong *puVar1;
  ulong uVar2;
  pointer pvVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  pointer pvVar7;
  ulong uVar8;
  long lVar9;
  pointer pvVar10;
  pointer pvVar11;
  int rowDelta;
  long lVar12;
  bool bVar13;
  
  uVar2 = (ulong)(uint)header;
  pvVar3 = (coverMatrix->
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = 1;
  do {
    pvVar7 = pvVar3;
    uVar8 = 1;
    do {
      uVar2 = (ulong)(int)uVar2;
      lVar9 = 1;
      pvVar10 = pvVar7;
      do {
        uVar4 = uVar2 + 0x3f;
        if (-1 < (long)uVar2) {
          uVar4 = uVar2;
        }
        lVar12 = 0;
        pvVar11 = pvVar10;
        do {
          lVar5 = 0;
          do {
            puVar1 = (ulong *)((ulong)((uVar2 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8 +
                              *(long *)((long)&(pvVar11->super__Bvector_base<std::allocator<bool>_>)
                                               ._M_impl.super__Bvector_impl_data + lVar5) +
                              ((long)uVar4 >> 6) * 8);
            *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
            lVar5 = lVar5 + 0x168;
          } while (lVar5 != 0x438);
          lVar12 = lVar12 + 1;
          pvVar11 = pvVar11 + 0x51;
        } while (lVar12 != 3);
        lVar9 = lVar9 + 1;
        uVar2 = uVar2 + 1;
        pvVar10 = pvVar10 + 1;
      } while (lVar9 != 10);
      pvVar7 = pvVar7 + 0x1b;
      bVar13 = uVar8 < 7;
      uVar8 = uVar8 + 3;
    } while (bVar13);
    pvVar3 = pvVar3 + 0xf3;
    bVar13 = uVar6 < 7;
    uVar6 = uVar6 + 3;
  } while (bVar13);
  return (int)uVar2;
}

Assistant:

int createBoxConstraints(vector<vector<bool> > &coverMatrix, int header){
    for (int row = COVER_START_INDEX; row <= SIZE; row += BOX_SIZE) {
      for (int column = COVER_START_INDEX; column <= SIZE; column += BOX_SIZE) {
        for (int n = COVER_START_INDEX; n <= SIZE; n++, header++) {
          for (int rowDelta = 0; rowDelta < BOX_SIZE; rowDelta++) {
            for (int columnDelta = 0; columnDelta < BOX_SIZE; columnDelta++) {
              int index = indexInCoverMatrix(row + rowDelta, column + columnDelta, n);
              //matrix[index][header] = 1;
              coverMatrix[index][header] = true;
            }
          }
        }
      }
    }
    return header;
}